

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getAutoVacuum(char *z)

{
  int iVar1;
  uint local_20;
  int i;
  char *z_local;
  
  iVar1 = sqlite3StrICmp(z,"none");
  if (iVar1 == 0) {
    z_local._4_4_ = 0;
  }
  else {
    iVar1 = sqlite3StrICmp(z,"full");
    if (iVar1 == 0) {
      z_local._4_4_ = 1;
    }
    else {
      iVar1 = sqlite3StrICmp(z,"incremental");
      if (iVar1 == 0) {
        z_local._4_4_ = 2;
      }
      else {
        local_20 = sqlite3Atoi(z);
        if (((int)local_20 < 0) || (2 < (int)local_20)) {
          local_20 = 0;
        }
        z_local._4_4_ = local_20 & 0xff;
      }
    }
  }
  return z_local._4_4_;
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}